

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void VisitList<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
               (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,
               _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *prefix,
               _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *postfix)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeBin *pPVar4;
  
  if (pnode == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x3c,"(pnode != nullptr)","pnode != nullptr");
    if (!bVar2) goto LAB_007873ce;
    *puVar3 = 0;
  }
  if (pnode->nop != knopList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x3d,"(pnode->nop == knopList)","pnode->nop == knopList");
    if (!bVar2) {
LAB_007873ce:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  do {
    pPVar4 = ParseNode::AsParseNodeBin(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar4->pnode1,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar4 = ParseNode::AsParseNodeBin(pnode);
    pnode = pPVar4->pnode2;
  } while (pnode->nop == knopList);
  Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
            (pnode,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
  return;
}

Assistant:

void VisitList(ParseNode *pnode, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix)
{
    Assert(pnode != nullptr);
    Assert(pnode->nop == knopList);

    do
    {
        ParseNode * pnode1 = pnode->AsParseNodeBin()->pnode1;
        Visit(pnode1, byteCodeGenerator, prefix, postfix);
        pnode = pnode->AsParseNodeBin()->pnode2;
    }
    while (pnode->nop == knopList);
    Visit(pnode, byteCodeGenerator, prefix, postfix);
}